

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void cxxopts::values::integer_parser<unsigned_short>(string *text,unsigned_short *value)

{
  bool bVar1;
  difference_type dVar2;
  undefined8 uVar3;
  const_reference pvVar4;
  reference pcVar5;
  unsigned_short *puVar6;
  unsigned_short *in_RSI;
  undefined8 in_RDI;
  US digit;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  iter;
  US result;
  value_type value_match;
  uint8_t base;
  bool negative;
  bool is_signed;
  unsigned_short umax;
  smatch match;
  string *in_stack_ffffffffffffff38;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffff50;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  ushort local_72;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  unsigned_short local_62;
  char *local_60;
  char *local_58;
  undefined8 local_50;
  byte local_45;
  byte local_44;
  undefined1 local_43;
  undefined2 local_42;
  undefined4 local_40;
  string *in_stack_ffffffffffffffd8;
  argument_incorrect_type *in_stack_ffffffffffffffe0;
  
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results(in_stack_ffffffffffffff40);
  std::
  regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             (match_flag_type)(in_stack_ffffffffffffff48 >> 0x20));
  dVar2 = std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::length(in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
  if (dVar2 == 0) {
    uVar3 = __cxa_allocate_exception(0x28);
    argument_incorrect_type::argument_incorrect_type
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    __cxa_throw(uVar3,&argument_incorrect_type::typeinfo,
                argument_incorrect_type::~argument_incorrect_type);
  }
  dVar2 = std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::length(in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
  if (dVar2 < 1) {
    local_42 = 0xffff;
    local_43 = 0;
    dVar2 = std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::length(in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
    local_44 = 0 < dVar2;
    dVar2 = std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::length(in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
    local_45 = 10;
    if (0 < dVar2) {
      local_45 = 0x10;
    }
    pvVar4 = std::__cxx11::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    local_70._M_current =
         (pvVar4->
         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ).first._M_current;
    local_58 = (pvVar4->
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).second._M_current;
    local_50 = *(undefined8 *)&pvVar4->matched;
    local_62 = 0;
    local_60 = local_70._M_current;
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_ffffffffffffff40,
                              (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_ffffffffffffff38), bVar1) {
      pcVar5 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_70);
      if ((*pcVar5 < '0') ||
         (pcVar5 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_70), '9' < *pcVar5)) {
        if ((local_45 == 0x10) &&
           ((pcVar5 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&local_70), '`' < *pcVar5 &&
            (pcVar5 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&local_70), *pcVar5 < 'g')))) {
          pcVar5 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_70);
          local_72 = (short)*pcVar5 - 0x57;
        }
        else {
          if ((local_45 != 0x10) ||
             ((pcVar5 = __gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*(&local_70), *pcVar5 < 'A' ||
              (pcVar5 = __gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*(&local_70), 'F' < *pcVar5)))) {
            uVar3 = __cxa_allocate_exception(0x28);
            argument_incorrect_type::argument_incorrect_type
                      (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
            __cxa_throw(uVar3,&argument_incorrect_type::typeinfo,
                        argument_incorrect_type::~argument_incorrect_type);
          }
          pcVar5 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_70);
          local_72 = (short)*pcVar5 - 0x37;
        }
      }
      else {
        pcVar5 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_70);
        local_72 = (short)*pcVar5 - 0x30;
      }
      if ((int)(0xffff - (uint)local_72) < (int)((uint)local_62 * (uint)local_45)) {
        uVar3 = __cxa_allocate_exception(0x28);
        argument_incorrect_type::argument_incorrect_type
                  (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
        __cxa_throw(uVar3,&argument_incorrect_type::typeinfo,
                    argument_incorrect_type::~argument_incorrect_type);
      }
      local_62 = local_62 * local_45 + local_72;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_70);
    }
    detail::check_signed_range<unsigned_short,unsigned_short>
              (SUB81((ulong)in_stack_ffffffffffffff40 >> 0x38,0),
               (unsigned_short)((ulong)in_stack_ffffffffffffff40 >> 0x20),in_stack_ffffffffffffff38)
    ;
    if ((local_44 & 1) == 0) {
      *in_RSI = local_62;
    }
    else {
      puVar6 = checked_negate<unsigned_short,unsigned_short&>(&local_62,in_RDI);
      *in_RSI = *puVar6;
    }
    local_40 = 0;
  }
  else {
    *in_RSI = 0;
    local_40 = 1;
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)0x17c10e);
  return;
}

Assistant:

void
        integer_parser(const std::string& text, T& value)
        {
            std::smatch match;
            std::regex_match(text, match, integer_pattern);

            if (match.length() == 0)
            {
                throw argument_incorrect_type(text);
            }

            if (match.length(4) > 0)
            {
                value = 0;
                return;
            }

            using US = typename std::make_unsigned<T>::type;

            constexpr auto umax = std::numeric_limits<US>::max();
            constexpr bool is_signed = std::numeric_limits<T>::is_signed;
            const bool negative = match.length(1) > 0;
            const uint8_t base = match.length(2) > 0 ? 16 : 10;

            auto value_match = match[3];

            US result = 0;

            for (auto iter = value_match.first; iter != value_match.second; ++iter)
            {
                US digit = 0;

                if (*iter >= '0' && *iter <= '9')
                {
                    digit = *iter - '0';
                }
                else if (base == 16 && *iter >= 'a' && *iter <= 'f')
                {
                    digit = *iter - 'a' + 10;
                }
                else if (base == 16 && *iter >= 'A' && *iter <= 'F')
                {
                    digit = *iter - 'A' + 10;
                }
                else
                {
                    throw argument_incorrect_type(text);
                }

                if (umax - digit < result * base)
                {
                    throw argument_incorrect_type(text);
                }

                result = result * base + digit;
            }

            detail::check_signed_range<T>(negative, result, text);

            if (negative)
            {
                value = checked_negate<T>(result,
                                          text,
                                          std::integral_constant<bool, is_signed>());
            }
            else
            {
                value = result;
            }
        }